

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<cv::Mat>,testing::Matcher<cv::Rect_<int>>>,std::tuple<cv::Mat,cv::Rect_<int>>>
               (tuple<testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_> *matcher_tuple,
               tuple<cv::Mat,_cv::Rect_<int>_> *value_tuple)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<cv::Mat>,testing::Matcher<cv::Rect_<int>>>,std::tuple<cv::Mat,cv::Rect_<int>>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    iVar3 = (*(((matcher_tuple->
                super__Tuple_impl<0UL,_testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_>
                ).super__Tuple_impl<1UL,_testing::Matcher<cv::Rect_<int>_>_>.
                super__Head_base<1UL,_testing::Matcher<cv::Rect_<int>_>,_false>._M_head_impl.
                super_MatcherBase<cv::Rect_<int>_>.impl_.value_)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface[4])();
    uVar2 = (undefined1)iVar3;
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }